

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

target_ulong helper_msa_cfcmsa_mips64(CPUMIPSState_conflict5 *env,uint32_t cs)

{
  if (cs == 1) {
    return (ulong)((env->active_tc).msacsr & 0x107ffff);
  }
  if (cs == 0) {
    return (long)env->msair;
  }
  return 0;
}

Assistant:

target_ulong helper_msa_cfcmsa(CPUMIPSState *env, uint32_t cs)
{
    switch (cs) {
    case 0:
        return env->msair;
    case 1:
        return env->active_tc.msacsr & MSACSR_MASK;
    }
    return 0;
}